

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O0

char * booster::locale::utf::utf_traits<char,1>::encode<char*>(code_point value,char *out)

{
  byte bVar1;
  char *out_local;
  code_point value_local;
  
  bVar1 = (byte)value;
  if (value < 0x80) {
    out_local = out + 1;
    *out = bVar1;
  }
  else if (value < 0x800) {
    *out = (byte)(value >> 6) | 0xc0;
    out_local = out + 2;
    out[1] = bVar1 & 0x3f | 0x80;
  }
  else if (value < 0x10000) {
    *out = (byte)(value >> 0xc) | 0xe0;
    out[1] = (byte)(value >> 6) & 0x3f | 0x80;
    out_local = out + 3;
    out[2] = bVar1 & 0x3f | 0x80;
  }
  else {
    *out = (byte)(value >> 0x12) | 0xf0;
    out[1] = (byte)(value >> 0xc) & 0x3f | 0x80;
    out[2] = (byte)(value >> 6) & 0x3f | 0x80;
    out_local = out + 4;
    out[3] = bVar1 & 0x3f | 0x80;
  }
  return out_local;
}

Assistant:

static Iterator encode(code_point value,Iterator out)
        {
            if(value <= 0x7F) {
                *out++ = static_cast<char_type>(value);
            }
            else if(value <= 0x7FF) {
                *out++ = static_cast<char_type>((value >> 6) | 0xC0);
                *out++ = static_cast<char_type>((value & 0x3F) | 0x80);
            }
            else if(BOOSTER_LOCALE_LIKELY(value <= 0xFFFF)) {
                *out++ = static_cast<char_type>((value >> 12) | 0xE0);
                *out++ = static_cast<char_type>(((value >> 6) & 0x3F) | 0x80);
                *out++ = static_cast<char_type>((value & 0x3F) | 0x80);
            }
            else {
                *out++ = static_cast<char_type>((value >> 18) | 0xF0);
                *out++ = static_cast<char_type>(((value >> 12) & 0x3F) | 0x80);
                *out++ = static_cast<char_type>(((value >> 6) & 0x3F) | 0x80);
                *out++ = static_cast<char_type>((value & 0x3F) | 0x80);
            }
            return out;
        }